

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O1

void __thiscall rw_shared_thread::operator()(rw_shared_thread *this)

{
  longlong lVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *this_00;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  ostringstream oss;
  string local_1c0 [32];
  ptime local_1a0 [23];
  
  booster::recursive_shared_mutex::shared_lock();
  booster::ptime::millisleep(500);
  auVar4 = booster::ptime::now();
  booster::recursive_shared_mutex::shared_lock();
  auVar5 = booster::ptime::now();
  booster::ptime::millisleep(200);
  booster::recursive_shared_mutex::unlock();
  booster::recursive_shared_mutex::unlock();
  local_1a0[0].sec = auVar5._0_8_ - auVar4._0_8_;
  local_1a0[0].nsec = auVar5._8_4_ - auVar4._8_4_;
  booster::ptime::normalize(local_1a0);
  iVar2 = local_1a0[0].nsec;
  lVar1 = local_1a0[0].sec;
  local_1a0[0].sec = 0;
  local_1a0[0].nsec = 100000000;
  booster::ptime::normalize(local_1a0);
  if ((local_1a0[0].sec <= lVar1) && ((local_1a0[0].sec < lVar1 || (local_1a0[0].nsec <= iVar2)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0xb1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," end-start < booster::ptime::milliseconds(100)",0x2e);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_00,local_1c0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *this->done = true;
  return;
}

Assistant:

void operator()() const
	{
		lp->shared_lock();
		booster::ptime::millisleep(500);
		booster::ptime start = booster::ptime::now();
		lp->shared_lock();
		booster::ptime end = booster::ptime::now();
		booster::ptime::millisleep(200);
		lp->unlock();
		lp->unlock();
		TEST(end-start < booster::ptime::milliseconds(100));
		*done = true;
	}